

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O3

void R_InstallSprite(int num)

{
  undefined8 *puVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  TextureHash *pTVar11;
  spriteframe_t *psVar12;
  uint uVar13;
  WORD WVar14;
  long lVar15;
  long lVar16;
  uint amount;
  ulong uVar17;
  int iVar18;
  int rot;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  
  if (maxframe == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    amount = maxframe + 1;
    uVar17 = (ulong)amount;
    bVar22 = -1 < maxframe;
    maxframe = amount;
    if (bVar22) {
      lVar19 = 0xaba078;
      lVar20 = 0xaba06c;
      lVar21 = 0xaba068;
      iVar29 = DAT_00790f80._4_4_;
      lVar16 = 0;
      auVar25 = _DAT_0073c1a0;
      auVar26 = _DAT_0073b2f0;
      auVar27 = _DAT_0073b300;
      auVar28 = _DAT_00790f80;
      do {
        iVar3 = *(int *)&sprtemp[lVar16].super_spriteframe_t.field_0x4c;
        if (iVar3 == 1) {
          lVar15 = 0;
          do {
            iVar3 = *(int *)(lVar20 + -4 + lVar15 * 4);
            iVar18 = *(int *)(lVar20 + lVar15 * 4);
            if (iVar18 < 1) {
              *(int *)(lVar20 + lVar15 * 4) = iVar3;
              uVar2 = sprtemp[lVar16].super_spriteframe_t.Flip;
              iVar18 = iVar3;
              if ((uVar2 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                sprtemp[lVar16].super_spriteframe_t.Flip =
                     uVar2 | (ushort)(2 << ((byte)lVar15 & 0x1f));
              }
            }
            if (iVar3 < 1) {
              *(int *)(lVar20 + -4 + lVar15 * 4) = iVar18;
              uVar2 = sprtemp[lVar16].super_spriteframe_t.Flip;
              if ((uVar2 >> ((byte)lVar15 & 0x1f) & 2) != 0) {
                sprtemp[lVar16].super_spriteframe_t.Flip =
                     uVar2 | (ushort)(1 << ((uint)lVar15 & 0x1f));
              }
            }
            lVar15 = lVar15 + 2;
          } while (lVar15 != 0x10);
          lVar15 = 0;
          do {
            if (*(int *)(lVar21 + lVar15 * 4) < 1) {
              I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                           sprites.Array + num,(ulong)((int)lVar16 + 0x41));
              auVar25 = _DAT_0073c1a0;
              auVar26 = _DAT_0073b2f0;
              auVar27 = _DAT_0073b300;
              auVar28 = _DAT_00790f80;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          uVar17 = (ulong)(uint)maxframe;
        }
        else if (iVar3 == 0) {
          iVar3 = sprtemp[lVar16].super_spriteframe_t.Texture[0].texnum;
          lVar15 = 0;
          do {
            auVar23._8_4_ = (int)lVar15;
            auVar23._0_8_ = lVar15;
            auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar24 = (auVar23 | auVar26) ^ auVar27;
            if (auVar24._4_4_ == iVar29 && auVar24._0_4_ < auVar28._0_4_) {
              *(int *)(lVar19 + -0xc + lVar15 * 4) = iVar3;
              *(int *)(lVar19 + -8 + lVar15 * 4) = iVar3;
            }
            auVar23 = (auVar23 | auVar25) ^ auVar27;
            if (auVar23._4_4_ == iVar29 && auVar23._0_4_ < auVar28._0_4_) {
              *(int *)(lVar19 + -4 + lVar15 * 4) = iVar3;
              *(int *)(lVar19 + lVar15 * 4) = iVar3;
            }
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x10);
          if ((sprtemp[lVar16].super_spriteframe_t.Flip & 1) != 0) {
            sprtemp[lVar16].super_spriteframe_t.Flip = 0xffff;
          }
        }
        lVar16 = lVar16 + 1;
        amount = (uint)uVar17;
        lVar19 = lVar19 + 0x50;
        lVar20 = lVar20 + 0x50;
        lVar21 = lVar21 + 0x50;
      } while (lVar16 < (int)amount);
      if (0 < (int)amount) {
        lVar16 = 0;
        do {
          if (*(int *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar16) == -1) {
            *(undefined4 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar16) = 0;
            *(undefined1 (*) [16])
             ((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + lVar16) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + lVar16)
                 = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + lVar16)
                 = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + lVar16)
                 = (undefined1  [16])0x0;
            *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + lVar16) = 0;
          }
          lVar16 = lVar16 + 0x50;
        } while (uVar17 * 0x50 != lVar16);
      }
    }
    sprites.Array[num].numframes = (BYTE)amount;
    TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,amount);
    uVar13 = SpriteFrames.Count;
    WVar14 = (WORD)SpriteFrames.Count;
    SpriteFrames.Count = amount + SpriteFrames.Count;
    sprites.Array[num].spriteframes = WVar14;
    iVar29 = maxframe;
    psVar12 = SpriteFrames.Array;
    lVar16 = (long)maxframe;
    if (0 < lVar16) {
      lVar19 = 0xaba068;
      lVar20 = 0;
      do {
        uVar4 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + lVar20);
        uVar5 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[2].texnum + lVar20);
        uVar6 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + lVar20);
        uVar7 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[6].texnum + lVar20);
        uVar8 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + lVar20);
        uVar9 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[10].texnum + lVar20);
        uVar10 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xe].texnum + lVar20)
        ;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[0xc].texnum + lVar20);
        *puVar1 = *(undefined8 *)
                   ((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + lVar20);
        puVar1[1] = uVar10;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[8].texnum + lVar20);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[4].texnum + lVar20);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[0].texnum + lVar20);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        *(undefined2 *)((long)(psVar12[(int)uVar13].Texture + 0x10) + lVar20) =
             *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + lVar20);
        *(undefined8 *)
         ((long)&((spriteframe_t *)(psVar12[(int)uVar13].Texture + -2))->Voxel + lVar20) =
             *(undefined8 *)
              ((long)&((spriteframe_t *)(sprtemp[0].super_spriteframe_t.Texture + -2))->Voxel +
              lVar20);
        pTVar11 = TexMan.Textures.Array;
        lVar20 = lVar20 + 0x50;
      } while (lVar16 * 0x50 != lVar20);
      if (0 < iVar29) {
        lVar20 = 0;
        do {
          if (*(int *)&sprtemp[lVar20].super_spriteframe_t.field_0x4c == 1) {
            lVar21 = 0;
            do {
              (pTVar11[*(int *)(lVar19 + lVar21 * 4)].Texture)->Rotations = (short)lVar20 + WVar14;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x10);
          }
          lVar20 = lVar20 + 1;
          lVar19 = lVar19 + 0x50;
        } while (lVar20 != lVar16);
      }
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}